

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void __thiscall testing::internal::DeathTestImpl::~DeathTestImpl(DeathTestImpl *this)

{
  bool bVar1;
  string *in_RDI;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_f0 [8];
  int *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  string local_28 [40];
  
  *(undefined ***)in_RDI = &PTR__DeathTestImpl_009650e0;
  do {
    bVar1 = IsTrue(*(int *)((long)&in_RDI[1].field_2 + 4) == -1);
    if (!bVar1) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &stack0xffffffffffffff37;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,
                 (allocator<char> *)in_stack_ffffffffffffff20);
      std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
      std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
      StreamableToString<int>(in_stack_ffffffffffffff18);
      std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
      std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
      DeathTestAbort(in_RDI);
      std::__cxx11::string::~string(local_28);
      std::__cxx11::string::~string(local_48);
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string(local_f0);
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string(local_a8);
      std::__cxx11::string::~string(local_c8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff37);
    }
    in_stack_fffffffffffffef7 = AlwaysFalse();
  } while ((bool)in_stack_fffffffffffffef7);
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            *)0x5a17c8);
  DeathTest::~DeathTest((DeathTest *)in_RDI);
  return;
}

Assistant:

~DeathTestImpl() override { GTEST_DEATH_TEST_CHECK_(read_fd_ == -1); }